

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,ShaderImageLoadStoreBase *this,GLenum e)

{
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  GLenum local_1c;
  ShaderImageLoadStoreBase *pSStack_18;
  GLenum e_local;
  ShaderImageLoadStoreBase *this_local;
  
  local_1c = e;
  pSStack_18 = this;
  this_local = (ShaderImageLoadStoreBase *)__return_storage_ptr__;
  if (e == 0x8058) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba8",&local_48);
    std::allocator<char>::~allocator(&local_48);
  }
  else if (e == 0x8059) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgb10_a2",&local_47);
    std::allocator<char>::~allocator(&local_47);
  }
  else if (e == 0x805b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba16",&local_46);
    std::allocator<char>::~allocator(&local_46);
  }
  else if (e == 0x8229) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r8",&local_4c);
    std::allocator<char>::~allocator(&local_4c);
  }
  else if (e == 0x822a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r16",&local_4b);
    std::allocator<char>::~allocator(&local_4b);
  }
  else if (e == 0x822b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg8",&local_4a);
    std::allocator<char>::~allocator(&local_4a);
  }
  else if (e == 0x822c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg16",&local_49);
    std::allocator<char>::~allocator(&local_49);
  }
  else if (e == 0x822d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r16f",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  else if (e == 0x822e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r32f",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else if (e == 0x822f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg16f",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  else if (e == 0x8230) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg32f",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else if (e == 0x8231) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r8i",&local_45);
    std::allocator<char>::~allocator(&local_45);
  }
  else if (e == 0x8232) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r8ui",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
  }
  else if (e == 0x8233) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r16i",&local_44);
    std::allocator<char>::~allocator(&local_44);
  }
  else if (e == 0x8234) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r16ui",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
  }
  else if (e == 0x8235) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r32i",&local_43);
    std::allocator<char>::~allocator(&local_43);
  }
  else if (e == 0x8236) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r32ui",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
  }
  else if (e == 0x8237) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg8i",&local_42);
    std::allocator<char>::~allocator(&local_42);
  }
  else if (e == 0x8238) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg8ui",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else if (e == 0x8239) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg16i",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else if (e == 0x823a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg16ui",&local_38);
    std::allocator<char>::~allocator(&local_38);
  }
  else if (e == 0x823b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg32i",&local_40);
    std::allocator<char>::~allocator(&local_40);
  }
  else if (e == 0x823c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg32ui",&local_37);
    std::allocator<char>::~allocator(&local_37);
  }
  else if (e == 0x8814) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba32f",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else if (e == 0x881a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba16f",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (e == 0x8c3a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r11f_g11f_b10f",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  else if (e == 0x8d70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba32ui",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  else if (e == 0x8d76) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba16ui",&local_34);
    std::allocator<char>::~allocator(&local_34);
  }
  else if (e == 0x8d7c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba8ui",&local_36);
    std::allocator<char>::~allocator(&local_36);
  }
  else if (e == 0x8d82) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba32i",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
  }
  else if (e == 0x8d88) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba16i",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
  }
  else if (e == 0x8d8e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba8i",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
  }
  else if (e == 0x8f94) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r8_snorm",&local_52);
    std::allocator<char>::~allocator(&local_52);
  }
  else if (e == 0x8f95) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg8_snorm",&local_50);
    std::allocator<char>::~allocator(&local_50);
  }
  else if (e == 0x8f97) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba8_snorm",&local_4e);
    std::allocator<char>::~allocator(&local_4e);
  }
  else if (e == 0x8f98) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"r16_snorm",&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  else if (e == 0x8f99) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rg16_snorm",&local_4f);
    std::allocator<char>::~allocator(&local_4f);
  }
  else if (e == 0x8f9b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgba16_snorm",&local_4d);
    std::allocator<char>::~allocator(&local_4d);
  }
  else {
    if (e != 0x906f) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x244,
                    "std::string gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::FormatEnumToString(GLenum)"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rgb10_a2ui",&local_35);
    std::allocator<char>::~allocator(&local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_RGBA32F:
			return "rgba32f";
		case GL_RGBA16F:
			return "rgba16f";
		case GL_RG32F:
			return "rg32f";
		case GL_RG16F:
			return "rg16f";
		case GL_R11F_G11F_B10F:
			return "r11f_g11f_b10f";
		case GL_R32F:
			return "r32f";
		case GL_R16F:
			return "r16f";

		case GL_RGBA32UI:
			return "rgba32ui";
		case GL_RGBA16UI:
			return "rgba16ui";
		case GL_RGB10_A2UI:
			return "rgb10_a2ui";
		case GL_RGBA8UI:
			return "rgba8ui";
		case GL_RG32UI:
			return "rg32ui";
		case GL_RG16UI:
			return "rg16ui";
		case GL_RG8UI:
			return "rg8ui";
		case GL_R32UI:
			return "r32ui";
		case GL_R16UI:
			return "r16ui";
		case GL_R8UI:
			return "r8ui";

		case GL_RGBA32I:
			return "rgba32i";
		case GL_RGBA16I:
			return "rgba16i";
		case GL_RGBA8I:
			return "rgba8i";
		case GL_RG32I:
			return "rg32i";
		case GL_RG16I:
			return "rg16i";
		case GL_RG8I:
			return "rg8i";
		case GL_R32I:
			return "r32i";
		case GL_R16I:
			return "r16i";
		case GL_R8I:
			return "r8i";

		case GL_RGBA16:
			return "rgba16";
		case GL_RGB10_A2:
			return "rgb10_a2";
		case GL_RGBA8:
			return "rgba8";
		case GL_RG16:
			return "rg16";
		case GL_RG8:
			return "rg8";
		case GL_R16:
			return "r16";
		case GL_R8:
			return "r8";

		case GL_RGBA16_SNORM:
			return "rgba16_snorm";
		case GL_RGBA8_SNORM:
			return "rgba8_snorm";
		case GL_RG16_SNORM:
			return "rg16_snorm";
		case GL_RG8_SNORM:
			return "rg8_snorm";
		case GL_R16_SNORM:
			return "r16_snorm";
		case GL_R8_SNORM:
			return "r8_snorm";
		}

		assert(0);
		return "";
	}